

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

bool absl::lts_20250127::str_format_internal::anon_unknown_0::ConvertNonNumericFloats<double>
               (char sign_char,double v,FormatConversionSpecImpl *conv,FormatSinkImpl *sink)

{
  FormatSinkImpl *this;
  FormatConversionChar FVar1;
  bool bVar2;
  uint uVar3;
  int width;
  char *local_58;
  char *local_50;
  string_view local_48;
  char *local_38;
  char *ptr;
  FormatSinkImpl *pFStack_28;
  char text [4];
  FormatSinkImpl *sink_local;
  FormatConversionSpecImpl *conv_local;
  double v_local;
  char sign_char_local;
  
  local_38 = (char *)((long)&ptr + 4);
  if (sign_char != '\0') {
    local_38 = (char *)((long)&ptr + 5);
    ptr._4_1_ = sign_char;
  }
  pFStack_28 = sink;
  uVar3 = std::isnan(v);
  if ((uVar3 & 1) == 0) {
    uVar3 = std::isinf(v);
    if ((uVar3 & 1) == 0) {
      return false;
    }
    FVar1 = FormatConversionSpecImpl::conversion_char(conv);
    bVar2 = FormatConversionCharIsUpper(FVar1);
    if (bVar2) {
      local_58 = "INF";
    }
    else {
      local_58 = "inf";
    }
    local_38 = std::copy_n<char_const*,int,char*>(local_58,3,local_38);
  }
  else {
    FVar1 = FormatConversionSpecImpl::conversion_char(conv);
    bVar2 = FormatConversionCharIsUpper(FVar1);
    if (bVar2) {
      local_50 = "NAN";
    }
    else {
      local_50 = "nan";
    }
    local_38 = std::copy_n<char_const*,int,char*>(local_50,3,local_38);
  }
  this = pFStack_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_48,(char *)((long)&ptr + 4),(long)local_38 - ((long)&ptr + 4));
  width = FormatConversionSpecImpl::width(conv);
  bVar2 = FormatConversionSpecImpl::has_left_flag(conv);
  bVar2 = FormatSinkImpl::PutPaddedString(this,local_48,width,-1,bVar2);
  return bVar2;
}

Assistant:

bool ConvertNonNumericFloats(char sign_char, Float v,
                             const FormatConversionSpecImpl &conv,
                             FormatSinkImpl *sink) {
  char text[4], *ptr = text;
  if (sign_char != '\0') *ptr++ = sign_char;
  if (std::isnan(v)) {
    ptr = std::copy_n(
        FormatConversionCharIsUpper(conv.conversion_char()) ? "NAN" : "nan", 3,
        ptr);
  } else if (std::isinf(v)) {
    ptr = std::copy_n(
        FormatConversionCharIsUpper(conv.conversion_char()) ? "INF" : "inf", 3,
        ptr);
  } else {
    return false;
  }

  return sink->PutPaddedString(
      string_view(text, static_cast<size_t>(ptr - text)), conv.width(), -1,
      conv.has_left_flag());
}